

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

float __thiscall
quantileloss::first_derivative(quantileloss *this,shared_data *param_1,float prediction,float label)

{
  float fVar1;
  
  fVar1 = label - prediction;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return 0.0;
  }
  return (float)(-(uint)(0.0 < fVar1) & (uint)-this->tau |
                ~-(uint)(0.0 < fVar1) & (uint)(1.0 - this->tau));
}

Assistant:

float first_derivative(shared_data*, float prediction, float label)
  {
    float e = label - prediction;
    if (e == 0)
      return 0;
    return e > 0 ? -tau : (1 - tau);
  }